

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O3

void cpsm::str_cat_impl<char_const*,unsigned_long>(stringstream *ss,char **x,unsigned_long args)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(ss + 0x10);
  __s = *x;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}